

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFFormFieldObjectHelper::setV
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *value,bool need_appearances)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  QPDF *qpdf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  string name;
  string local_98;
  string local_78;
  QPDFObjectHandle local_58;
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  
  getFieldType_abi_cxx11_(&local_98,this);
  iVar3 = std::__cxx11::string::compare((char *)&local_98);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 != 0) {
    bVar2 = QPDFObjectHandle::isString(value);
    if (bVar2) {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/V","");
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_78,value);
      QPDFObjectHandle::newUnicodeString(&local_38,&local_78);
      setFieldAttribute(this,&local_98,&local_38);
      if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/V","");
      local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (value->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (value->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      setFieldAttribute(this,&local_98,&local_58);
      if (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (!need_appearances) {
      return;
    }
    local_78._M_dataplus._M_p =
         (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_string_length =
         (size_type)
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "QPDFFormFieldObjectHelper::setV called with need_appearances = true on an object that is not associated with an owning QPDF"
               ,"");
    qpdf = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_78,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
    }
    QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
              ((QPDFAcroFormDocumentHelper *)&local_98,qpdf);
    QPDFAcroFormDocumentHelper::setNeedAppearances((QPDFAcroFormDocumentHelper *)&local_98,true);
    QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)&local_98)
    ;
    return;
  }
  bVar2 = isCheckbox(this);
  if (bVar2) {
    bVar2 = QPDFObjectHandle::isName(value);
    if (bVar2) {
      QPDFObjectHandle::getName_abi_cxx11_(&local_98,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_98);
      setCheckBoxValue(this,iVar3 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        return;
      }
    }
    local_78._M_dataplus._M_p =
         (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_string_length =
         (size_type)
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "ignoring attempt to set a checkbox field to a value whose type is not name","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_78,&local_98);
  }
  else {
    bVar2 = isRadioButton(this);
    if (bVar2) {
      bVar2 = QPDFObjectHandle::isName(value);
      if (bVar2) {
        local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (value->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (value->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_48.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_48.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        setRadioButtonValue(this,&local_48);
        this_00._M_pi =
             local_48.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        goto LAB_0016ae53;
      }
      local_78._M_dataplus._M_p =
           (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78._M_string_length =
           (size_type)
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
                 _M_use_count + 1;
        }
      }
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "ignoring attempt to set a radio button field to an object that is not a name","");
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_78,&local_98);
    }
    else {
      bVar2 = isPushbutton(this);
      if (!bVar2) {
        return;
      }
      local_78._M_dataplus._M_p =
           (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78._M_string_length =
           (size_type)
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length)->
                 _M_use_count + 1;
        }
      }
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"ignoring attempt set the value of a pushbutton field","");
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_78,&local_98);
    }
  }
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
  }
LAB_0016ae53:
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setV(QPDFObjectHandle value, bool need_appearances)
{
    if (getFieldType() == "/Btn") {
        if (isCheckbox()) {
            bool okay = false;
            if (value.isName()) {
                std::string name = value.getName();
                okay = true;
                // Accept any value other than /Off to mean checked. Files have been seen that use
                // /1 or other values.
                setCheckBoxValue((name != "/Off"));
            }
            if (!okay) {
                oh().warnIfPossible(
                    "ignoring attempt to set a checkbox field to a value whose type is not name");
            }
        } else if (isRadioButton()) {
            if (value.isName()) {
                setRadioButtonValue(value);
            } else {
                oh().warnIfPossible(
                    "ignoring attempt to set a radio button field to an object that is not a name");
            }
        } else if (isPushbutton()) {
            oh().warnIfPossible("ignoring attempt set the value of a pushbutton field");
        }
        return;
    }
    if (value.isString()) {
        setFieldAttribute("/V", QPDFObjectHandle::newUnicodeString(value.getUTF8Value()));
    } else {
        setFieldAttribute("/V", value);
    }
    if (need_appearances) {
        QPDF& qpdf = oh().getQPDF(
            "QPDFFormFieldObjectHelper::setV called with need_appearances = "
            "true on an object that is not associated with an owning QPDF");
        QPDFAcroFormDocumentHelper(qpdf).setNeedAppearances(true);
    }
}